

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O1

int liq_lookup(char *name)

{
  pointer plVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  pointer plVar5;
  pointer plVar6;
  
  plVar1 = liq_table.super__Vector_base<liq_type,_std::allocator<liq_type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar4 = (long)liq_table.super__Vector_base<liq_type,_std::allocator<liq_type>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)liq_table.super__Vector_base<liq_type,_std::allocator<liq_type>_>._M_impl.
                super__Vector_impl_data._M_start >> 7;
  plVar5 = liq_table.super__Vector_base<liq_type,_std::allocator<liq_type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    plVar5 = liq_table.super__Vector_base<liq_type,_std::allocator<liq_type>_>._M_impl.
             super__Vector_impl_data._M_start + 2;
    do {
      plVar6 = plVar5;
      if ((plVar6[-2].liq_name != (char *)0x0) &&
         (bVar2 = str_prefix(name,plVar6[-2].liq_name), !bVar2)) {
        plVar6 = plVar6 + -2;
        goto LAB_002a1406;
      }
      if ((plVar6[-1].liq_name != (char *)0x0) &&
         (bVar2 = str_prefix(name,plVar6[-1].liq_name), !bVar2)) {
        plVar6 = plVar6 + -1;
        goto LAB_002a1406;
      }
      if ((plVar6->liq_name != (char *)0x0) && (bVar2 = str_prefix(name,plVar6->liq_name), !bVar2))
      goto LAB_002a1406;
      if ((plVar6[1].liq_name != (char *)0x0) &&
         (bVar2 = str_prefix(name,plVar6[1].liq_name), !bVar2)) {
        plVar6 = plVar6 + 1;
        goto LAB_002a1406;
      }
      lVar4 = lVar4 + -1;
      plVar5 = plVar6 + 4;
    } while (1 < lVar4);
    plVar5 = plVar6 + 2;
  }
  lVar4 = (long)plVar1 - (long)plVar5 >> 5;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      plVar6 = plVar1;
      if ((lVar4 != 3) ||
         ((plVar5->liq_name != (char *)0x0 &&
          (bVar2 = str_prefix(name,plVar5->liq_name), plVar6 = plVar5, !bVar2)))) goto LAB_002a1406;
      plVar5 = plVar5 + 1;
    }
    if ((plVar5->liq_name != (char *)0x0) &&
       (bVar2 = str_prefix(name,plVar5->liq_name), plVar6 = plVar5, !bVar2)) goto LAB_002a1406;
    plVar5 = plVar5 + 1;
  }
  plVar6 = plVar1;
  if ((plVar5->liq_name != (char *)0x0) &&
     (bVar2 = str_prefix(name,plVar5->liq_name), plVar6 = plVar5, bVar2)) {
    plVar6 = plVar1;
  }
LAB_002a1406:
  iVar3 = (int)((ulong)((long)plVar6 -
                       (long)liq_table.super__Vector_base<liq_type,_std::allocator<liq_type>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 5);
  if (plVar6 == liq_table.super__Vector_base<liq_type,_std::allocator<liq_type>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int liq_lookup(const char *name)
{
	auto it = std::find_if(liq_table.begin(), liq_table.end(), [name] (auto liquid) {
		return liquid.liq_name != nullptr && !str_prefix(name, liquid.liq_name);
	});

	return it != liq_table.end()
		? it - liq_table.begin()
		: 0;
}